

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDASetId(void *ida_mem,N_Vector id)

{
  undefined8 uVar1;
  int iVar2;
  
  if (ida_mem == (void *)0x0) {
    iVar2 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x21f,"IDASetId",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    if (id == (N_Vector)0x0) {
      if (*(int *)((long)ida_mem + 0x69c) != 0) {
        N_VDestroy(*(undefined8 *)((long)ida_mem + 0x2a8));
        *(long *)((long)ida_mem + 0x678) =
             *(long *)((long)ida_mem + 0x678) - *(long *)((long)ida_mem + 0x658);
        *(long *)((long)ida_mem + 0x680) =
             *(long *)((long)ida_mem + 0x680) - *(long *)((long)ida_mem + 0x660);
      }
      *(undefined4 *)((long)ida_mem + 0x69c) = 0;
    }
    else {
      if (*(int *)((long)ida_mem + 0x69c) == 0) {
        uVar1 = N_VClone(id);
        *(undefined8 *)((long)ida_mem + 0x2a8) = uVar1;
        *(long *)((long)ida_mem + 0x678) =
             *(long *)((long)ida_mem + 0x678) + *(long *)((long)ida_mem + 0x658);
        *(long *)((long)ida_mem + 0x680) =
             *(long *)((long)ida_mem + 0x680) + *(long *)((long)ida_mem + 0x660);
        *(undefined4 *)((long)ida_mem + 0x69c) = 1;
      }
      else {
        uVar1 = *(undefined8 *)((long)ida_mem + 0x2a8);
      }
      N_VScale(0x3ff0000000000000,id,uVar1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int IDASetId(void* ida_mem, N_Vector id)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (id == NULL)
  {
    if (IDA_mem->ida_idMallocDone)
    {
      N_VDestroy(IDA_mem->ida_id);
      IDA_mem->ida_lrw -= IDA_mem->ida_lrw1;
      IDA_mem->ida_liw -= IDA_mem->ida_liw1;
    }
    IDA_mem->ida_idMallocDone = SUNFALSE;
    return (IDA_SUCCESS);
  }

  if (!(IDA_mem->ida_idMallocDone))
  {
    IDA_mem->ida_id = N_VClone(id);
    IDA_mem->ida_lrw += IDA_mem->ida_lrw1;
    IDA_mem->ida_liw += IDA_mem->ida_liw1;
    IDA_mem->ida_idMallocDone = SUNTRUE;
  }

  /* Load the id vector */

  N_VScale(ONE, id, IDA_mem->ida_id);

  return (IDA_SUCCESS);
}